

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrgload.c
# Opt level: O1

FT_Error pfr_glyph_line_to(PFR_Glyph glyph,FT_Vector *to)

{
  short *psVar1;
  FT_Vector *pFVar2;
  short sVar3;
  FT_GlyphLoader loader;
  FT_Pos FVar4;
  int iVar5;
  
  if (glyph->path_begun != '\0') {
    loader = glyph->loader;
    iVar5 = 0;
    if (loader->max_points <
        (int)(loader->current).outline.n_points + (int)(loader->base).outline.n_points + 1U) {
      iVar5 = FT_GlyphLoader_CheckPoints(loader,1,0);
    }
    if (iVar5 == 0) {
      sVar3 = (loader->current).outline.n_points;
      FVar4 = to->y;
      pFVar2 = (loader->current).outline.points + sVar3;
      pFVar2->x = to->x;
      pFVar2->y = FVar4;
      (loader->current).outline.tags[sVar3] = '\x01';
      psVar1 = &(loader->current).outline.n_points;
      *psVar1 = *psVar1 + 1;
      iVar5 = 0;
    }
    return iVar5;
  }
  return 8;
}

Assistant:

static FT_Error
  pfr_glyph_line_to( PFR_Glyph   glyph,
                     FT_Vector*  to )
  {
    FT_GlyphLoader  loader  = glyph->loader;
    FT_Outline*     outline = &loader->current.outline;
    FT_Error        error;


    /* check that we have begun a new path */
    if ( !glyph->path_begun )
    {
      error = FT_THROW( Invalid_Table );
      FT_ERROR(( "pfr_glyph_line_to: invalid glyph data\n" ));
      goto Exit;
    }

    error = FT_GLYPHLOADER_CHECK_POINTS( loader, 1, 0 );
    if ( !error )
    {
      FT_Int  n = outline->n_points;


      outline->points[n] = *to;
      outline->tags  [n] = FT_CURVE_TAG_ON;

      outline->n_points++;
    }

  Exit:
    return error;
  }